

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

String * __thiscall
axl::err::StdErrorProvider::getStackErrorDescription(StdErrorProvider *this,ErrorRef *error)

{
  undefined1 uVar1;
  ErrorHdr *pEVar2;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *in_RDX;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  void *end;
  ErrorHdr *p;
  String *string;
  StringRef *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  ErrorHdr *this_00;
  ErrorHdr *local_28;
  
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1325b9);
  local_28 = rc::BufRef::operator_cast_to_ErrorHdr_((BufRef *)in_RDX);
  pEVar2 = rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::getEnd(in_RDX);
  this_00 = pEVar2;
  for (local_28 = local_28 + 1; local_28 < pEVar2;
      local_28 = (ErrorHdr *)((long)&local_28->m_size + (ulong)local_28->m_size)) {
    uVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RDI);
    if (!(bool)uVar1) {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff60),(C *)in_stack_ffffffffffffff58);
    }
    ErrorRef::ErrorRef((ErrorRef *)CONCAT17(uVar1,in_stack_ffffffffffffff60),
                       (ErrorHdr *)in_stack_ffffffffffffff58);
    ErrorRef::getDescription((ErrorRef *)this_00);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x132691);
    ErrorRef::~ErrorRef((ErrorRef *)0x13269b);
  }
  return (String *)in_RDI;
}

Assistant:

sl::String
StdErrorProvider::getStackErrorDescription(const ErrorRef& error) {
	sl::String string;

	const ErrorHdr* p = error + 1;
	const void* end = error.getEnd();

	while (p < end) {
		ASSERT(p->m_size >= sizeof(ErrorHdr));

		if (!string.isEmpty())
			string += ": ";

		string += ErrorRef(p).getDescription();
		p = (ErrorHdr*)((uchar_t*)p + p->m_size);
	}

	return string;
}